

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderMaxAtomicCounterBuffersTest::iterate
          (GeometryShaderMaxAtomicCounterBuffersTest *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *pNVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ulong uVar10;
  GLuint *pGVar11;
  int *piVar12;
  GLuint *ptrABO_data;
  GLint n_acb_1;
  int atomic_counter_id;
  GLuint vertex_id;
  GLint n_acb;
  string local_460;
  string local_440;
  string local_420;
  MessageBuilder local_400;
  undefined1 local_27a;
  allocator<char> local_279;
  string local_278;
  MessageBuilder local_258;
  char *local_d8;
  char *vs_code_specialized_raw;
  string local_c8 [8];
  string vs_code_specialized;
  char *gs_code_specialized_raw;
  string local_98 [8];
  string gs_code_specialized;
  char *fs_code_specialized_raw;
  allocator<char> local_59;
  string local_58 [8];
  string fs_code_specialized;
  undefined4 uStack_30;
  bool result;
  GLuint number_of_indices;
  GLuint initial_ac_data;
  bool has_shader_compilation_failed;
  Functions *gl;
  char *pcStack_18;
  uint expected_value;
  char *vs_code;
  GeometryShaderMaxAtomicCounterBuffersTest *this_local;
  
  pcStack_18 = 
  "${VERSION}\n\nflat out int vertex_id;\n\nvoid main()\n{\n    vertex_id    = gl_VertexID;\n    gl_Position  = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
  ;
  gl._4_4_ = 0;
  vs_code = (char *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _initial_ac_data = CONCAT44(extraout_var,iVar3);
  number_of_indices._3_1_ = 1;
  uStack_30 = 0;
  fs_code_specialized.field_2._12_4_ = this->m_gl_max_geometry_atomic_counter_buffers_ext_value << 7
  ;
  fs_code_specialized.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"",&local_59);
  std::allocator<char>::~allocator(&local_59);
  gs_code_specialized.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"",(allocator<char> *)((long)&gs_code_specialized_raw + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gs_code_specialized_raw + 7));
  vs_code_specialized.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"",(allocator<char> *)((long)&vs_code_specialized_raw + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vs_code_specialized_raw + 7));
  local_d8 = (char *)0x0;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar7,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xa2b);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  (**(code **)(_initial_ac_data + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             &this->m_gl_max_geometry_atomic_counter_buffers_ext_value);
  dVar4 = (**(code **)(_initial_ac_data + 0x800))();
  glu::checkError(dVar4,
                  "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xa31);
  (**(code **)(_initial_ac_data + 0x868))
            (0x92dc,&this->m_gl_max_atomic_counter_buffer_bindings_value);
  dVar4 = (**(code **)(_initial_ac_data + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xa35);
  if (this->m_gl_max_geometry_atomic_counter_buffers_ext_value < 1) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_258,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_258,
                        (char (*) [56])"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c316fc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,&this->m_gl_max_geometry_atomic_counter_buffers_ext_value);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [75])
                               "] is less than or equal to zero. Atomic Counter Buffers are not supported."
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    if (this->m_gl_max_geometry_atomic_counter_buffers_ext_value == 0) {
      local_27a = 1;
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT is 0",&local_279);
      tcu::NotSupportedError::NotSupportedError(pNVar7,&local_278);
      local_27a = 0;
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    fs_code_specialized.field_2._M_local_buf[0xb] = '\0';
  }
  else if (this->m_gl_max_atomic_counter_buffer_bindings_value <
           this->m_gl_max_geometry_atomic_counter_buffers_ext_value) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_400,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_400,
                        (char (*) [56])"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c316fc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,&this->m_gl_max_geometry_atomic_counter_buffers_ext_value);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [70])
                               "] is greater than GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS query value ["
                       );
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,&this->m_gl_max_atomic_counter_buffer_bindings_value);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_400);
    fs_code_specialized.field_2._M_local_buf[0xb] = '\0';
  }
  else {
    GVar5 = (**(code **)(_initial_ac_data + 0x3c8))();
    this->m_po_id = GVar5;
    dVar4 = (**(code **)(_initial_ac_data + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xa5c);
    GVar5 = (**(code **)(_initial_ac_data + 0x3f0))(0x8b30);
    this->m_fs_id = GVar5;
    GVar5 = (**(code **)(_initial_ac_data + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar5;
    GVar5 = (**(code **)(_initial_ac_data + 0x3f0))(0x8b31);
    this->m_vs_id = GVar5;
    dVar4 = (**(code **)(_initial_ac_data + 0x800))();
    glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xa63);
    TestCaseBase::specializeShader_abi_cxx11_(&local_420,&this->super_TestCaseBase,1,&dummy_fs_code)
    ;
    std::__cxx11::string::operator=(local_58,(string *)&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    getGSCode_abi_cxx11_(&local_440,this);
    std::__cxx11::string::operator=(local_98,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_
              (&local_460,&this->super_TestCaseBase,1,&stack0xffffffffffffffe8);
    std::__cxx11::string::operator=(local_c8,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    local_d8 = (char *)std::__cxx11::string::c_str();
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                       (char **)((long)&vs_code_specialized.field_2 + 8),this->m_vs_id,1,&local_d8,
                       this->m_fs_id,1,(char **)((long)&gs_code_specialized.field_2 + 8),
                       (bool *)((long)&number_of_indices + 3));
    if (bVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
      uVar10 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pGVar11 = (GLuint *)operator_new__(uVar10);
      this->m_acbo_ids = pGVar11;
      (**(code **)(_initial_ac_data + 0x6c8))
                (this->m_gl_max_geometry_atomic_counter_buffers_ext_value,this->m_acbo_ids);
      dVar4 = (**(code **)(_initial_ac_data + 0x800))();
      glu::checkError(dVar4,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa7e);
      for (atomic_counter_id = 0;
          atomic_counter_id < this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
          atomic_counter_id = atomic_counter_id + 1) {
        (**(code **)(_initial_ac_data + 0x40))(0x92c0,this->m_acbo_ids[atomic_counter_id]);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa83);
        (**(code **)(_initial_ac_data + 0x150))(0x92c0,4,&stack0xffffffffffffffd0,0x88ea);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa87);
        (**(code **)(_initial_ac_data + 0x48))
                  (0x92c0,atomic_counter_id,this->m_acbo_ids[atomic_counter_id]);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"bindBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa8a);
      }
      (**(code **)(_initial_ac_data + 0x708))(1,&this->m_vao_id);
      dVar4 = (**(code **)(_initial_ac_data + 0x800))();
      glu::checkError(dVar4,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa8f);
      (**(code **)(_initial_ac_data + 0xd8))(this->m_vao_id);
      dVar4 = (**(code **)(_initial_ac_data + 0x800))();
      glu::checkError(dVar4,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa92);
      (**(code **)(_initial_ac_data + 0x1680))(this->m_po_id);
      dVar4 = (**(code **)(_initial_ac_data + 0x800))();
      glu::checkError(dVar4,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa96);
      (**(code **)(_initial_ac_data + 0x538))(0,0,fs_code_specialized.field_2._12_4_);
      dVar4 = (**(code **)(_initial_ac_data + 0x800))();
      glu::checkError(dVar4,"glDrawArrays() call failed for GL_POINTS pname.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa99);
      for (n_acb_1 = 0; (uint)n_acb_1 < (uint)fs_code_specialized.field_2._12_4_;
          n_acb_1 = n_acb_1 + 1) {
        for (ptrABO_data._4_4_ = 1;
            (int)ptrABO_data._4_4_ <= this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
            ptrABO_data._4_4_ = ptrABO_data._4_4_ + 1) {
          if ((uint)n_acb_1 % ptrABO_data._4_4_ == 0) {
            gl._4_4_ = gl._4_4_ + 1;
          }
        }
      }
      for (ptrABO_data._0_4_ = 0;
          (int)ptrABO_data < this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
          ptrABO_data._0_4_ = (int)ptrABO_data + 1) {
        (**(code **)(_initial_ac_data + 0x40))(0x92c0,this->m_acbo_ids[(int)ptrABO_data]);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xaaf);
        piVar12 = (int *)(**(code **)(_initial_ac_data + 0xd00))(0x92c0,0,4,1);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"glMapBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xab3);
        if (*piVar12 != gl._4_4_) {
          fs_code_specialized.field_2._M_local_buf[0xb] = '\0';
          break;
        }
        (**(code **)(_initial_ac_data + 0x1670))(0x92c0);
        dVar4 = (**(code **)(_initial_ac_data + 0x800))();
        glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xabc);
      }
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&vertex_id,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&vertex_id,(char (*) [31])0x2ae9b7e);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vertex_id);
      fs_code_specialized.field_2._M_local_buf[0xb] = '\0';
    }
  }
  if ((fs_code_specialized.field_2._M_local_buf[0xb] & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_58);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMaxAtomicCounterBuffersTest::iterate()
{
	/* Define Vertex Shader's code for the purpose of this test. */
	const char* vs_code = "${VERSION}\n"
						  "\n"
						  "flat out int vertex_id;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    vertex_id    = gl_VertexID;\n"
						  "    gl_Position  = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	unsigned int		  expected_value				= 0;
	const glw::Functions& gl							= m_context.getRenderContext().getFunctions();
	bool				  has_shader_compilation_failed = true;
	const glw::GLuint	 initial_ac_data				= 0;
	const glw::GLuint	 number_of_indices				= 128 * m_gl_max_geometry_atomic_counter_buffers_ext_value;
	bool				  result						= true;

	std::string fs_code_specialized		= "";
	const char* fs_code_specialized_raw = DE_NULL;
	std::string gs_code_specialized		= "";
	const char* gs_code_specialized_raw = DE_NULL;
	std::string vs_code_specialized		= "";
	const char* vs_code_specialized_raw = DE_NULL;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
				   &m_gl_max_geometry_atomic_counter_buffers_ext_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname");

	/* Retrieve GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname value */
	gl.getIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &m_gl_max_atomic_counter_buffer_bindings_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname");

	/* Check if m_gl_max_geometry_atomic_counter_buffers_ext_value is less than or equal zero. */
	if (m_gl_max_geometry_atomic_counter_buffers_ext_value <= 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value "
						   << "[" << m_gl_max_geometry_atomic_counter_buffers_ext_value
						   << "]"
							  " is less than or equal to zero. Atomic Counter Buffers"
							  " are not supported."
						   << tcu::TestLog::EndMessage;

		if (m_gl_max_geometry_atomic_counter_buffers_ext_value == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT is 0");
		}
		else
		{
			result = false;
			goto end;
		}
	}

	/* Check if m_gl_max_atomic_counter_buffer_bindings_value is less than m_gl_max_shader_storage_blocks_value. */
	if (m_gl_max_atomic_counter_buffer_bindings_value < m_gl_max_geometry_atomic_counter_buffers_ext_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value "
						   << "[" << m_gl_max_geometry_atomic_counter_buffers_ext_value
						   << "]"
							  " is greater than GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS query value "
							  "["
						   << m_gl_max_atomic_counter_buffer_bindings_value << "]." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create a program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	fs_code_specialized_raw = fs_code_specialized.c_str();

	gs_code_specialized		= getGSCode();
	gs_code_specialized_raw = gs_code_specialized.c_str();

	vs_code_specialized		= specializeShader(1, &vs_code);
	vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create Atomic Counter Buffer Objects. */
	m_acbo_ids = new glw::GLuint[m_gl_max_geometry_atomic_counter_buffers_ext_value];

	gl.genBuffers(m_gl_max_geometry_atomic_counter_buffers_ext_value, m_acbo_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	for (glw::GLint n_acb = 0; n_acb < m_gl_max_geometry_atomic_counter_buffers_ext_value; ++n_acb)
	{
		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo_ids[n_acb]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.");

		gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(glw::GLuint), &initial_ac_data /*initialize with zeroes*/,
					  GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, n_acb /*binding index*/, m_acbo_ids[n_acb] /*buffer*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bindBufferRange() call failed.");
	}

	/* Configure VAO. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Use program. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.drawArrays(GL_POINTS, 0 /*starting index*/, number_of_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

	/* Calculate expected value. */
	/* For each point being processed by Geometry Shader. */
	for (glw::GLuint vertex_id = 0; vertex_id < number_of_indices; ++vertex_id)
	{
		/* And for each atomic counter ID. */
		for (int atomic_counter_id = 1; atomic_counter_id <= m_gl_max_geometry_atomic_counter_buffers_ext_value;
			 ++atomic_counter_id)
		{
			/* Check if (vertex_id % atomic_counter_id) == 0. If it is true, increment expected_value. */
			if (vertex_id % atomic_counter_id == 0)
			{
				++expected_value;
			}
		}
	}

	/* Retrieve values from Atomic Counter Buffer Objects and check if these values are valid. */
	for (glw::GLint n_acb = 0; n_acb < m_gl_max_geometry_atomic_counter_buffers_ext_value; ++n_acb)
	{
		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo_ids[n_acb]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

		glw::GLuint* ptrABO_data = (glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0 /*offset*/,
																   sizeof(glw::GLuint) /*length*/, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		if (ptrABO_data[0] != expected_value)
		{
			result = false;
			break;
		}

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

		ptrABO_data = NULL;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}